

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<8,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  byte bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  char cVar31;
  AABBNodeMB4D *node1;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong *puVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar40 [16];
  undefined1 auVar43 [32];
  float fVar46;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar58 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  float fVar65;
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar68 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  float fVar72;
  vfloat4 a0;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  float fVar79;
  undefined1 auVar80 [32];
  float fVar81;
  float fVar85;
  float fVar86;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [32];
  float fVar92;
  float fVar95;
  float fVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar104;
  undefined1 auVar102 [16];
  float fVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 in_ZMM14 [64];
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  Precalculations pre;
  NodeRef stack [564];
  float local_1218 [4];
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_11d8 != 8) && (fVar118 = ray->tfar, 0.0 <= fVar118)) {
    aVar7 = (ray->dir).field_0.field_1;
    auVar52 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
    auVar40 = vrsqrtss_avx(auVar52,auVar52);
    fVar72 = auVar40._0_4_;
    local_1218[0] = fVar72 * 1.5 - auVar52._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
    fVar72 = (ray->dir).field_0.m128[0];
    fVar3 = (ray->dir).field_0.m128[1];
    fVar4 = (ray->dir).field_0.m128[2];
    auVar47 = vshufps_avx(ZEXT416((uint)local_1218[0]),ZEXT416((uint)local_1218[0]),0);
    auVar73._0_4_ = aVar7.x * auVar47._0_4_;
    auVar73._4_4_ = aVar7.y * auVar47._4_4_;
    auVar73._8_4_ = aVar7.z * auVar47._8_4_;
    auVar73._12_4_ = aVar7.field_3.w * auVar47._12_4_;
    auVar40 = vshufpd_avx(auVar73,auVar73,1);
    auVar52 = vmovshdup_avx(auVar73);
    auVar93._8_4_ = 0x80000000;
    auVar93._0_8_ = 0x8000000080000000;
    auVar93._12_4_ = 0x80000000;
    auVar77._12_4_ = 0;
    auVar77._0_12_ = ZEXT812(0);
    auVar77 = auVar77 << 0x20;
    auVar57 = vunpckhps_avx(auVar73,auVar77);
    auVar66 = vshufps_avx(auVar57,ZEXT416(auVar52._0_4_ ^ 0x80000000),0x41);
    auVar82._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar82._8_8_ = auVar40._8_8_ ^ auVar93._8_8_;
    auVar57 = vinsertps_avx(auVar82,auVar73,0x2a);
    auVar52 = vdpps_avx(auVar66,auVar66,0x7f);
    auVar40 = vdpps_avx(auVar57,auVar57,0x7f);
    auVar52 = vcmpps_avx(auVar40,auVar52,1);
    auVar52 = vshufps_avx(auVar52,auVar52,0);
    auVar52 = vblendvps_avx(auVar57,auVar66,auVar52);
    auVar40 = vdpps_avx(auVar52,auVar52,0x7f);
    auVar57 = vrsqrtss_avx(auVar40,auVar40);
    fVar79 = auVar57._0_4_;
    auVar40 = ZEXT416((uint)(fVar79 * 1.5 - auVar40._0_4_ * 0.5 * fVar79 * fVar79 * fVar79));
    auVar40 = vshufps_avx(auVar40,auVar40,0);
    auVar83._0_4_ = auVar52._0_4_ * auVar40._0_4_;
    auVar83._4_4_ = auVar52._4_4_ * auVar40._4_4_;
    auVar83._8_4_ = auVar52._8_4_ * auVar40._8_4_;
    auVar83._12_4_ = auVar52._12_4_ * auVar40._12_4_;
    auVar52 = vshufps_avx(auVar83,auVar83,0xc9);
    auVar40 = vshufps_avx(auVar73,auVar73,0xc9);
    auVar102._0_4_ = auVar40._0_4_ * auVar83._0_4_;
    auVar102._4_4_ = auVar40._4_4_ * auVar83._4_4_;
    auVar102._8_4_ = auVar40._8_4_ * auVar83._8_4_;
    auVar102._12_4_ = auVar40._12_4_ * auVar83._12_4_;
    auVar94._0_4_ = auVar52._0_4_ * auVar73._0_4_;
    auVar94._4_4_ = auVar52._4_4_ * auVar73._4_4_;
    auVar94._8_4_ = auVar52._8_4_ * auVar73._8_4_;
    auVar94._12_4_ = auVar52._12_4_ * auVar73._12_4_;
    auVar52 = vsubps_avx(auVar94,auVar102);
    auVar57 = vshufps_avx(auVar52,auVar52,0xc9);
    auVar52 = vdpps_avx(auVar57,auVar57,0x7f);
    auVar40 = vrsqrtss_avx(auVar52,auVar52);
    fVar79 = auVar40._0_4_;
    auVar52 = ZEXT416((uint)(fVar79 * 1.5 - auVar52._0_4_ * 0.5 * fVar79 * fVar79 * fVar79));
    auVar52 = vshufps_avx(auVar52,auVar52,0);
    auVar40._0_4_ = auVar57._0_4_ * auVar52._0_4_;
    auVar40._4_4_ = auVar57._4_4_ * auVar52._4_4_;
    auVar40._8_4_ = auVar57._8_4_ * auVar52._8_4_;
    auVar40._12_4_ = auVar57._12_4_ * auVar52._12_4_;
    auVar52._0_4_ = auVar47._0_4_ * auVar73._0_4_;
    auVar52._4_4_ = auVar47._4_4_ * auVar73._4_4_;
    auVar52._8_4_ = auVar47._8_4_ * auVar73._8_4_;
    auVar52._12_4_ = auVar47._12_4_ * auVar73._12_4_;
    auVar57 = vunpcklps_avx(auVar83,auVar52);
    auVar52 = vunpckhps_avx(auVar83,auVar52);
    auVar47 = vunpcklps_avx(auVar40,auVar77);
    auVar40 = vunpckhps_avx(auVar40,auVar77);
    local_11e8 = vunpcklps_avx(auVar52,auVar40);
    local_1208 = vunpcklps_avx(auVar57,auVar47);
    local_11f8 = vunpckhps_avx(auVar57,auVar47);
    puVar37 = local_11d0;
    auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    auVar56 = ZEXT1664(auVar40);
    auVar57._8_4_ = 0x7fffffff;
    auVar57._0_8_ = 0x7fffffff7fffffff;
    auVar57._12_4_ = 0x7fffffff;
    auVar52 = vandps_avx((undefined1  [16])aVar7,auVar57);
    auVar66._8_4_ = 0x219392ef;
    auVar66._0_8_ = 0x219392ef219392ef;
    auVar66._12_4_ = 0x219392ef;
    auVar52 = vcmpps_avx(auVar52,auVar66,1);
    auVar52 = vblendvps_avx((undefined1  [16])aVar7,auVar66,auVar52);
    auVar57 = vrcpps_avx(auVar52);
    fVar87 = auVar57._0_4_;
    auVar47._0_4_ = auVar52._0_4_ * fVar87;
    fVar81 = auVar57._4_4_;
    auVar47._4_4_ = auVar52._4_4_ * fVar81;
    fVar92 = auVar57._8_4_;
    auVar47._8_4_ = auVar52._8_4_ * fVar92;
    fVar119 = auVar57._12_4_;
    auVar47._12_4_ = auVar52._12_4_ * fVar119;
    auVar67._8_4_ = 0x3f800000;
    auVar67._0_8_ = 0x3f8000003f800000;
    auVar67._12_4_ = 0x3f800000;
    auVar52 = vsubps_avx(auVar67,auVar47);
    fVar79 = (ray->org).field_0.m128[0];
    fVar5 = (ray->org).field_0.m128[1];
    fVar6 = (ray->org).field_0.m128[2];
    auVar48._0_4_ = fVar87 + fVar87 * auVar52._0_4_;
    auVar48._4_4_ = fVar81 + fVar81 * auVar52._4_4_;
    auVar48._8_4_ = fVar92 + fVar92 * auVar52._8_4_;
    auVar48._12_4_ = fVar119 + fVar119 * auVar52._12_4_;
    auVar47 = vshufps_avx(auVar48,auVar48,0);
    auVar52 = vmovshdup_avx(auVar48);
    auVar64 = ZEXT1664(auVar52);
    auVar66 = vshufps_avx(auVar48,auVar48,0x55);
    auVar57 = vshufpd_avx(auVar48,auVar48,1);
    auVar71 = ZEXT1664(auVar57);
    auVar77 = vshufps_avx(auVar48,auVar48,0xaa);
    uVar39 = (ulong)(auVar48._0_4_ < 0.0) * 0x20;
    uVar38 = (ulong)(auVar52._0_4_ < 0.0) << 5 | 0x40;
    uVar36 = (ulong)(auVar57._0_4_ < 0.0) << 5 | 0x80;
    auVar52 = vshufps_avx(auVar40,auVar40,0);
    auVar109._16_16_ = auVar52;
    auVar109._0_16_ = auVar52;
    auVar52 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
    auVar106._16_16_ = auVar52;
    auVar106._0_16_ = auVar52;
LAB_002e1cb1:
    do {
      if (puVar37 == &local_11d8) {
        return;
      }
      uVar33 = puVar37[-1];
      puVar37 = puVar37 + -1;
      while ((uVar33 & 8) == 0) {
        fVar118 = (ray->dir).field_0.m128[3];
        uVar34 = (uint)uVar33 & 7;
        uVar32 = uVar33 & 0xfffffffffffffff0;
        fVar87 = auVar47._12_4_;
        if (uVar34 == 3) {
          fVar26 = *(float *)(uVar32 + 0xbc);
          auVar40 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
          fVar108 = auVar40._0_4_;
          fVar111 = auVar40._4_4_;
          fVar112 = auVar40._8_4_;
          fVar113 = auVar40._12_4_;
          fVar118 = 1.0 - fVar118;
          auVar40 = vshufps_avx(ZEXT416((uint)(fVar118 * 0.0)),ZEXT416((uint)(fVar118 * 0.0)),0);
          fVar101 = auVar40._0_4_;
          fVar103 = auVar40._4_4_;
          fVar104 = auVar40._8_4_;
          fVar105 = auVar40._12_4_;
          auVar51._0_4_ =
               fVar72 * *(float *)(uVar32 + 0x40) +
               fVar3 * *(float *)(uVar32 + 0xa0) + *(float *)(uVar32 + 0x100) * fVar4;
          auVar51._4_4_ =
               fVar72 * *(float *)(uVar32 + 0x44) +
               fVar3 * *(float *)(uVar32 + 0xa4) + *(float *)(uVar32 + 0x104) * fVar4;
          auVar51._8_4_ =
               fVar72 * *(float *)(uVar32 + 0x48) +
               fVar3 * *(float *)(uVar32 + 0xa8) + *(float *)(uVar32 + 0x108) * fVar4;
          auVar51._12_4_ =
               fVar72 * *(float *)(uVar32 + 0x4c) +
               fVar3 * *(float *)(uVar32 + 0xac) + *(float *)(uVar32 + 0x10c) * fVar4;
          auVar51._16_4_ =
               fVar72 * *(float *)(uVar32 + 0x50) +
               fVar3 * *(float *)(uVar32 + 0xb0) + *(float *)(uVar32 + 0x110) * fVar4;
          auVar51._20_4_ =
               fVar72 * *(float *)(uVar32 + 0x54) +
               fVar3 * *(float *)(uVar32 + 0xb4) + *(float *)(uVar32 + 0x114) * fVar4;
          auVar51._24_4_ =
               fVar72 * *(float *)(uVar32 + 0x58) +
               fVar3 * *(float *)(uVar32 + 0xb8) + *(float *)(uVar32 + 0x118) * fVar4;
          auVar51._28_4_ = fVar105 + in_ZMM14._28_4_ + 0.0;
          auVar115._0_4_ =
               *(float *)(uVar32 + 0x60) * fVar72 +
               *(float *)(uVar32 + 0xc0) * fVar3 + fVar4 * *(float *)(uVar32 + 0x120);
          auVar115._4_4_ =
               *(float *)(uVar32 + 100) * fVar72 +
               *(float *)(uVar32 + 0xc4) * fVar3 + fVar4 * *(float *)(uVar32 + 0x124);
          auVar115._8_4_ =
               *(float *)(uVar32 + 0x68) * fVar72 +
               *(float *)(uVar32 + 200) * fVar3 + fVar4 * *(float *)(uVar32 + 0x128);
          auVar115._12_4_ =
               *(float *)(uVar32 + 0x6c) * fVar72 +
               *(float *)(uVar32 + 0xcc) * fVar3 + fVar4 * *(float *)(uVar32 + 300);
          auVar115._16_4_ =
               *(float *)(uVar32 + 0x70) * fVar72 +
               *(float *)(uVar32 + 0xd0) * fVar3 + fVar4 * *(float *)(uVar32 + 0x130);
          auVar115._20_4_ =
               *(float *)(uVar32 + 0x74) * fVar72 +
               *(float *)(uVar32 + 0xd4) * fVar3 + fVar4 * *(float *)(uVar32 + 0x134);
          auVar115._24_4_ =
               *(float *)(uVar32 + 0x78) * fVar72 +
               *(float *)(uVar32 + 0xd8) * fVar3 + fVar4 * *(float *)(uVar32 + 0x138);
          auVar115._28_4_ = auVar52._12_4_ + in_ZMM14._28_4_ + fVar105;
          auVar80._0_4_ =
               fVar3 * *(float *)(uVar32 + 0xe0) + fVar4 * *(float *)(uVar32 + 0x140) +
               *(float *)(uVar32 + 0x80) * fVar72;
          auVar80._4_4_ =
               fVar3 * *(float *)(uVar32 + 0xe4) + fVar4 * *(float *)(uVar32 + 0x144) +
               *(float *)(uVar32 + 0x84) * fVar72;
          auVar80._8_4_ =
               fVar3 * *(float *)(uVar32 + 0xe8) + fVar4 * *(float *)(uVar32 + 0x148) +
               *(float *)(uVar32 + 0x88) * fVar72;
          auVar80._12_4_ =
               fVar3 * *(float *)(uVar32 + 0xec) + fVar4 * *(float *)(uVar32 + 0x14c) +
               *(float *)(uVar32 + 0x8c) * fVar72;
          auVar80._16_4_ =
               fVar3 * *(float *)(uVar32 + 0xf0) + fVar4 * *(float *)(uVar32 + 0x150) +
               *(float *)(uVar32 + 0x90) * fVar72;
          auVar80._20_4_ =
               fVar3 * *(float *)(uVar32 + 0xf4) + fVar4 * *(float *)(uVar32 + 0x154) +
               *(float *)(uVar32 + 0x94) * fVar72;
          auVar80._24_4_ =
               fVar3 * *(float *)(uVar32 + 0xf8) + fVar4 * *(float *)(uVar32 + 0x158) +
               *(float *)(uVar32 + 0x98) * fVar72;
          auVar80._28_4_ = fVar105 + auVar52._12_4_ + 0.0;
          auVar43._8_4_ = 0x7fffffff;
          auVar43._0_8_ = 0x7fffffff7fffffff;
          auVar43._12_4_ = 0x7fffffff;
          auVar43._16_4_ = 0x7fffffff;
          auVar43._20_4_ = 0x7fffffff;
          auVar43._24_4_ = 0x7fffffff;
          auVar43._28_4_ = 0x7fffffff;
          auVar45 = vandps_avx(auVar51,auVar43);
          auVar61._8_4_ = 0x219392ef;
          auVar61._0_8_ = 0x219392ef219392ef;
          auVar61._12_4_ = 0x219392ef;
          auVar61._16_4_ = 0x219392ef;
          auVar61._20_4_ = 0x219392ef;
          auVar61._24_4_ = 0x219392ef;
          auVar61._28_4_ = 0x219392ef;
          auVar45 = vcmpps_avx(auVar45,auVar61,1);
          auVar11 = vblendvps_avx(auVar51,auVar61,auVar45);
          auVar45 = vandps_avx(auVar115,auVar43);
          auVar9 = vcmpps_avx(auVar45,auVar61,1);
          auVar10 = vblendvps_avx(auVar115,auVar61,auVar9);
          auVar45 = vandps_avx(auVar80,auVar43);
          auVar45 = vcmpps_avx(auVar45,auVar61,1);
          auVar45 = vblendvps_avx(auVar80,auVar61,auVar45);
          auVar40 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
          fVar118 = auVar40._0_4_;
          auVar110._0_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x220);
          fVar81 = auVar40._4_4_;
          auVar110._4_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x224);
          fVar92 = auVar40._8_4_;
          auVar110._8_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 0x228);
          fVar119 = auVar40._12_4_;
          auVar110._12_4_ = fVar119 + fVar113 * *(float *)(uVar32 + 0x22c);
          auVar110._16_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x230);
          auVar110._20_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x234);
          auVar110._24_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 0x238);
          auVar110._28_4_ = fVar119 + 0.0;
          auVar114._0_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x240);
          auVar114._4_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x244);
          auVar114._8_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 0x248);
          auVar114._12_4_ = fVar119 + fVar113 * *(float *)(uVar32 + 0x24c);
          auVar114._16_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x250);
          auVar114._20_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x254);
          auVar114._24_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 600);
          auVar114._28_4_ = fVar119 + auVar9._28_4_;
          auVar116._0_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x260);
          auVar116._4_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x264);
          auVar116._8_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 0x268);
          auVar116._12_4_ = fVar119 + fVar113 * *(float *)(uVar32 + 0x26c);
          auVar116._16_4_ = fVar118 + fVar108 * *(float *)(uVar32 + 0x270);
          auVar116._20_4_ = fVar81 + fVar111 * *(float *)(uVar32 + 0x274);
          auVar116._24_4_ = fVar92 + fVar112 * *(float *)(uVar32 + 0x278);
          auVar116._28_4_ = fVar119 + NAN;
          auVar9 = vrcpps_avx(auVar11);
          fVar118 = auVar9._0_4_;
          fVar119 = auVar9._4_4_;
          auVar19._4_4_ = auVar11._4_4_ * fVar119;
          auVar19._0_4_ = auVar11._0_4_ * fVar118;
          fVar120 = auVar9._8_4_;
          auVar19._8_4_ = auVar11._8_4_ * fVar120;
          fVar121 = auVar9._12_4_;
          auVar19._12_4_ = auVar11._12_4_ * fVar121;
          fVar122 = auVar9._16_4_;
          auVar19._16_4_ = auVar11._16_4_ * fVar122;
          fVar123 = auVar9._20_4_;
          auVar19._20_4_ = auVar11._20_4_ * fVar123;
          fVar124 = auVar9._24_4_;
          auVar19._24_4_ = auVar11._24_4_ * fVar124;
          auVar19._28_4_ = auVar11._28_4_;
          auVar62._8_4_ = 0x3f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._12_4_ = 0x3f800000;
          auVar62._16_4_ = 0x3f800000;
          auVar62._20_4_ = 0x3f800000;
          auVar62._24_4_ = 0x3f800000;
          auVar62._28_4_ = 0x3f800000;
          auVar9 = vsubps_avx(auVar62,auVar19);
          fVar118 = fVar118 + fVar118 * auVar9._0_4_;
          fVar119 = fVar119 + fVar119 * auVar9._4_4_;
          fVar120 = fVar120 + fVar120 * auVar9._8_4_;
          fVar121 = fVar121 + fVar121 * auVar9._12_4_;
          fVar122 = fVar122 + fVar122 * auVar9._16_4_;
          fVar123 = fVar123 + fVar123 * auVar9._20_4_;
          fVar124 = fVar124 + fVar124 * auVar9._24_4_;
          auVar11 = vrcpps_avx(auVar10);
          fVar81 = auVar11._0_4_;
          fVar85 = auVar11._4_4_;
          auVar20._4_4_ = auVar10._4_4_ * fVar85;
          auVar20._0_4_ = auVar10._0_4_ * fVar81;
          fVar86 = auVar11._8_4_;
          auVar20._8_4_ = auVar10._8_4_ * fVar86;
          fVar88 = auVar11._12_4_;
          auVar20._12_4_ = auVar10._12_4_ * fVar88;
          fVar89 = auVar11._16_4_;
          auVar20._16_4_ = auVar10._16_4_ * fVar89;
          fVar90 = auVar11._20_4_;
          auVar20._20_4_ = auVar10._20_4_ * fVar90;
          fVar91 = auVar11._24_4_;
          auVar20._24_4_ = auVar10._24_4_ * fVar91;
          auVar20._28_4_ = auVar9._28_4_;
          auVar9 = vsubps_avx(auVar62,auVar20);
          auVar10 = vrcpps_avx(auVar45);
          fVar81 = fVar81 + fVar81 * auVar9._0_4_;
          fVar85 = fVar85 + fVar85 * auVar9._4_4_;
          fVar86 = fVar86 + fVar86 * auVar9._8_4_;
          fVar88 = fVar88 + fVar88 * auVar9._12_4_;
          fVar89 = fVar89 + fVar89 * auVar9._16_4_;
          fVar90 = fVar90 + fVar90 * auVar9._20_4_;
          fVar91 = fVar91 + fVar91 * auVar9._24_4_;
          fVar92 = auVar10._0_4_;
          fVar95 = auVar10._4_4_;
          auVar9._4_4_ = auVar45._4_4_ * fVar95;
          auVar9._0_4_ = auVar45._0_4_ * fVar92;
          fVar96 = auVar10._8_4_;
          auVar9._8_4_ = auVar45._8_4_ * fVar96;
          fVar97 = auVar10._12_4_;
          auVar9._12_4_ = auVar45._12_4_ * fVar97;
          fVar98 = auVar10._16_4_;
          auVar9._16_4_ = auVar45._16_4_ * fVar98;
          fVar99 = auVar10._20_4_;
          auVar9._20_4_ = auVar45._20_4_ * fVar99;
          fVar100 = auVar10._24_4_;
          auVar9._24_4_ = auVar45._24_4_ * fVar100;
          auVar9._28_4_ = auVar11._28_4_;
          auVar11 = vsubps_avx(auVar62,auVar9);
          fVar92 = fVar92 + fVar92 * auVar11._0_4_;
          fVar95 = fVar95 + fVar95 * auVar11._4_4_;
          fVar96 = fVar96 + fVar96 * auVar11._8_4_;
          fVar97 = fVar97 + fVar97 * auVar11._12_4_;
          fVar98 = fVar98 + fVar98 * auVar11._16_4_;
          fVar99 = fVar99 + fVar99 * auVar11._20_4_;
          fVar100 = fVar100 + fVar100 * auVar11._24_4_;
          fVar46 = auVar11._28_4_ + auVar45._28_4_ + *(float *)(uVar32 + 0x17c);
          fVar65 = fVar26 + fVar6 + *(float *)(uVar32 + 0x1bc);
          auVar70._0_4_ =
               fVar79 * *(float *)(uVar32 + 0x40) +
               fVar5 * *(float *)(uVar32 + 0xa0) +
               *(float *)(uVar32 + 0x100) * fVar6 + *(float *)(uVar32 + 0x160);
          auVar70._4_4_ =
               fVar79 * *(float *)(uVar32 + 0x44) +
               fVar5 * *(float *)(uVar32 + 0xa4) +
               *(float *)(uVar32 + 0x104) * fVar6 + *(float *)(uVar32 + 0x164);
          auVar70._8_4_ =
               fVar79 * *(float *)(uVar32 + 0x48) +
               fVar5 * *(float *)(uVar32 + 0xa8) +
               *(float *)(uVar32 + 0x108) * fVar6 + *(float *)(uVar32 + 0x168);
          auVar70._12_4_ =
               fVar79 * *(float *)(uVar32 + 0x4c) +
               fVar5 * *(float *)(uVar32 + 0xac) +
               *(float *)(uVar32 + 0x10c) * fVar6 + *(float *)(uVar32 + 0x16c);
          auVar70._16_4_ =
               fVar79 * *(float *)(uVar32 + 0x50) +
               fVar5 * *(float *)(uVar32 + 0xb0) +
               *(float *)(uVar32 + 0x110) * fVar6 + *(float *)(uVar32 + 0x170);
          auVar70._20_4_ =
               fVar79 * *(float *)(uVar32 + 0x54) +
               fVar5 * *(float *)(uVar32 + 0xb4) +
               *(float *)(uVar32 + 0x114) * fVar6 + *(float *)(uVar32 + 0x174);
          auVar70._24_4_ =
               fVar79 * *(float *)(uVar32 + 0x58) +
               fVar5 * *(float *)(uVar32 + 0xb8) +
               *(float *)(uVar32 + 0x118) * fVar6 + *(float *)(uVar32 + 0x178);
          auVar70._28_4_ = fVar26 + fVar46;
          auVar76._0_4_ =
               *(float *)(uVar32 + 0x60) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xc0) +
               fVar6 * *(float *)(uVar32 + 0x120) + *(float *)(uVar32 + 0x180);
          auVar76._4_4_ =
               *(float *)(uVar32 + 100) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xc4) +
               fVar6 * *(float *)(uVar32 + 0x124) + *(float *)(uVar32 + 0x184);
          auVar76._8_4_ =
               *(float *)(uVar32 + 0x68) * fVar79 +
               fVar5 * *(float *)(uVar32 + 200) +
               fVar6 * *(float *)(uVar32 + 0x128) + *(float *)(uVar32 + 0x188);
          auVar76._12_4_ =
               *(float *)(uVar32 + 0x6c) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xcc) +
               fVar6 * *(float *)(uVar32 + 300) + *(float *)(uVar32 + 0x18c);
          auVar76._16_4_ =
               *(float *)(uVar32 + 0x70) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xd0) +
               fVar6 * *(float *)(uVar32 + 0x130) + *(float *)(uVar32 + 400);
          auVar76._20_4_ =
               *(float *)(uVar32 + 0x74) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xd4) +
               fVar6 * *(float *)(uVar32 + 0x134) + *(float *)(uVar32 + 0x194);
          auVar76._24_4_ =
               *(float *)(uVar32 + 0x78) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xd8) +
               fVar6 * *(float *)(uVar32 + 0x138) + *(float *)(uVar32 + 0x198);
          auVar76._28_4_ = fVar46 + fVar26 + auVar10._28_4_ + *(float *)(uVar32 + 0x19c);
          auVar78._0_4_ =
               *(float *)(uVar32 + 0x80) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xe0) +
               fVar6 * *(float *)(uVar32 + 0x140) + *(float *)(uVar32 + 0x1a0);
          auVar78._4_4_ =
               *(float *)(uVar32 + 0x84) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xe4) +
               fVar6 * *(float *)(uVar32 + 0x144) + *(float *)(uVar32 + 0x1a4);
          auVar78._8_4_ =
               *(float *)(uVar32 + 0x88) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xe8) +
               fVar6 * *(float *)(uVar32 + 0x148) + *(float *)(uVar32 + 0x1a8);
          auVar78._12_4_ =
               *(float *)(uVar32 + 0x8c) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xec) +
               fVar6 * *(float *)(uVar32 + 0x14c) + *(float *)(uVar32 + 0x1ac);
          auVar78._16_4_ =
               *(float *)(uVar32 + 0x90) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xf0) +
               fVar6 * *(float *)(uVar32 + 0x150) + *(float *)(uVar32 + 0x1b0);
          auVar78._20_4_ =
               *(float *)(uVar32 + 0x94) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xf4) +
               fVar6 * *(float *)(uVar32 + 0x154) + *(float *)(uVar32 + 0x1b4);
          auVar78._24_4_ =
               *(float *)(uVar32 + 0x98) * fVar79 +
               fVar5 * *(float *)(uVar32 + 0xf8) +
               fVar6 * *(float *)(uVar32 + 0x158) + *(float *)(uVar32 + 0x1b8);
          auVar78._28_4_ = fVar46 + fVar65;
          auVar45._4_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 0x1c4);
          auVar45._0_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x1c0);
          auVar45._8_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x1c8);
          auVar45._12_4_ = fVar105 + fVar113 * *(float *)(uVar32 + 0x1cc);
          auVar45._16_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x1d0);
          auVar45._20_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 0x1d4);
          auVar45._24_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x1d8);
          auVar45._28_4_ = fVar105 + 0.0;
          auVar45 = vsubps_avx(auVar45,auVar70);
          auVar30._4_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 0x1e4);
          auVar30._0_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x1e0);
          auVar30._8_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x1e8);
          auVar30._12_4_ = fVar105 + fVar113 * *(float *)(uVar32 + 0x1ec);
          auVar30._16_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x1f0);
          auVar30._20_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 500);
          auVar30._24_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x1f8);
          auVar30._28_4_ = fVar105 + fVar87;
          auVar11 = vsubps_avx(auVar30,auVar76);
          auVar10._4_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 0x204);
          auVar10._0_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x200);
          auVar10._8_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x208);
          auVar10._12_4_ = fVar105 + fVar113 * *(float *)(uVar32 + 0x20c);
          auVar10._16_4_ = fVar101 + fVar108 * *(float *)(uVar32 + 0x210);
          auVar10._20_4_ = fVar103 + fVar111 * *(float *)(uVar32 + 0x214);
          auVar10._24_4_ = fVar104 + fVar112 * *(float *)(uVar32 + 0x218);
          auVar10._28_4_ = fVar105 + 0.0;
          auVar10 = vsubps_avx(auVar10,auVar78);
          auVar58._0_4_ = fVar118 * auVar45._0_4_;
          auVar58._4_4_ = fVar119 * auVar45._4_4_;
          auVar58._8_4_ = fVar120 * auVar45._8_4_;
          auVar58._12_4_ = fVar121 * auVar45._12_4_;
          auVar21._16_4_ = fVar122 * auVar45._16_4_;
          auVar21._0_16_ = auVar58;
          auVar21._20_4_ = fVar123 * auVar45._20_4_;
          auVar21._24_4_ = fVar124 * auVar45._24_4_;
          auVar21._28_4_ = fVar65;
          auVar53._0_4_ = fVar81 * auVar11._0_4_;
          auVar53._4_4_ = fVar85 * auVar11._4_4_;
          auVar53._8_4_ = fVar86 * auVar11._8_4_;
          auVar53._12_4_ = fVar88 * auVar11._12_4_;
          auVar22._16_4_ = fVar89 * auVar11._16_4_;
          auVar22._0_16_ = auVar53;
          auVar22._20_4_ = fVar90 * auVar11._20_4_;
          auVar22._24_4_ = fVar91 * auVar11._24_4_;
          auVar22._28_4_ = auVar11._28_4_;
          auVar41._0_4_ = fVar92 * auVar10._0_4_;
          auVar41._4_4_ = fVar95 * auVar10._4_4_;
          auVar41._8_4_ = fVar96 * auVar10._8_4_;
          auVar41._12_4_ = fVar97 * auVar10._12_4_;
          auVar23._16_4_ = fVar98 * auVar10._16_4_;
          auVar23._0_16_ = auVar41;
          auVar23._20_4_ = fVar99 * auVar10._20_4_;
          auVar23._24_4_ = fVar100 * auVar10._24_4_;
          auVar23._28_4_ = auVar45._28_4_;
          auVar45 = vsubps_avx(auVar110,auVar70);
          auVar11 = vsubps_avx(auVar114,auVar76);
          auVar10 = vsubps_avx(auVar116,auVar78);
          auVar68._0_4_ = fVar118 * auVar45._0_4_;
          auVar68._4_4_ = fVar119 * auVar45._4_4_;
          auVar68._8_4_ = fVar120 * auVar45._8_4_;
          auVar68._12_4_ = fVar121 * auVar45._12_4_;
          auVar24._16_4_ = fVar122 * auVar45._16_4_;
          auVar24._0_16_ = auVar68;
          auVar24._20_4_ = fVar123 * auVar45._20_4_;
          auVar24._24_4_ = fVar124 * auVar45._24_4_;
          auVar24._28_4_ = auVar45._28_4_;
          auVar74._0_4_ = fVar81 * auVar11._0_4_;
          auVar74._4_4_ = fVar85 * auVar11._4_4_;
          auVar74._8_4_ = fVar86 * auVar11._8_4_;
          auVar74._12_4_ = fVar88 * auVar11._12_4_;
          auVar25._16_4_ = fVar89 * auVar11._16_4_;
          auVar25._0_16_ = auVar74;
          auVar25._20_4_ = fVar90 * auVar11._20_4_;
          auVar25._24_4_ = fVar91 * auVar11._24_4_;
          auVar25._28_4_ = auVar11._28_4_;
          auVar49._0_4_ = fVar92 * auVar10._0_4_;
          auVar49._4_4_ = fVar95 * auVar10._4_4_;
          auVar49._8_4_ = fVar96 * auVar10._8_4_;
          auVar49._12_4_ = fVar97 * auVar10._12_4_;
          auVar11._16_4_ = fVar98 * auVar10._16_4_;
          auVar11._0_16_ = auVar49;
          auVar11._20_4_ = fVar99 * auVar10._20_4_;
          auVar11._24_4_ = fVar100 * auVar10._24_4_;
          auVar11._28_4_ = fVar105 + 0.0;
          auVar40 = vpminsd_avx(auVar21._16_16_,auVar24._16_16_);
          auVar57 = vpminsd_avx(auVar58,auVar68);
          auVar84._16_16_ = auVar40;
          auVar84._0_16_ = auVar57;
          auVar40 = vpminsd_avx(auVar22._16_16_,auVar25._16_16_);
          auVar57 = vpminsd_avx(auVar53,auVar74);
          auVar107._16_16_ = auVar40;
          auVar107._0_16_ = auVar57;
          auVar40 = vpminsd_avx(auVar23._16_16_,auVar11._16_16_);
          auVar57 = vpminsd_avx(auVar41,auVar49);
          auVar117._16_16_ = auVar40;
          auVar117._0_16_ = auVar57;
          in_ZMM14 = ZEXT3264(auVar117);
          auVar45 = vmaxps_avx(auVar107,auVar117);
          auVar40 = vpmaxsd_avx(auVar21._16_16_,auVar24._16_16_);
          auVar57 = vpmaxsd_avx(auVar58,auVar68);
          auVar63._16_16_ = auVar40;
          auVar63._0_16_ = auVar57;
          auVar64 = ZEXT3264(auVar63);
          auVar40 = vpmaxsd_avx(auVar22._16_16_,auVar25._16_16_);
          auVar57 = vpmaxsd_avx(auVar53,auVar74);
          auVar55._16_16_ = auVar40;
          auVar55._0_16_ = auVar57;
          auVar40 = vpmaxsd_avx(auVar23._16_16_,auVar11._16_16_);
          auVar71 = ZEXT1664(auVar40);
          auVar57 = vpmaxsd_avx(auVar41,auVar49);
          auVar44._16_16_ = auVar40;
          auVar44._0_16_ = auVar57;
          auVar10 = vminps_avx(auVar55,auVar44);
          auVar11 = vmaxps_avx(auVar109,auVar84);
          auVar45 = vmaxps_avx(auVar11,auVar45);
          auVar11 = vminps_avx(auVar106,auVar63);
          auVar10 = vminps_avx(auVar11,auVar10);
          auVar45 = vcmpps_avx(auVar45,auVar10,2);
LAB_002e21fd:
          auVar40 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
        }
        else {
          auVar40 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
          auVar42._16_16_ = auVar40;
          auVar42._0_16_ = auVar40;
          pfVar2 = (float *)(uVar32 + 0x100 + uVar39);
          fVar118 = auVar40._0_4_;
          fVar81 = auVar40._4_4_;
          fVar92 = auVar40._8_4_;
          fVar119 = auVar40._12_4_;
          pfVar1 = (float *)(uVar32 + 0x40 + uVar39);
          auVar50._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar50._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar50._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar50._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar50._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar50._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar50._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar50._28_4_ = pfVar1[7] + 0.0;
          auVar29._4_4_ = fVar79;
          auVar29._0_4_ = fVar79;
          auVar29._8_4_ = fVar79;
          auVar29._12_4_ = fVar79;
          auVar29._16_4_ = fVar79;
          auVar29._20_4_ = fVar79;
          auVar29._24_4_ = fVar79;
          auVar29._28_4_ = fVar79;
          auVar45 = vsubps_avx(auVar50,auVar29);
          fVar85 = auVar47._0_4_;
          fVar95 = auVar47._4_4_;
          auVar13._4_4_ = fVar95 * auVar45._4_4_;
          auVar13._0_4_ = fVar85 * auVar45._0_4_;
          fVar120 = auVar47._8_4_;
          auVar13._8_4_ = fVar120 * auVar45._8_4_;
          auVar13._12_4_ = fVar87 * auVar45._12_4_;
          auVar13._16_4_ = fVar85 * auVar45._16_4_;
          auVar13._20_4_ = fVar95 * auVar45._20_4_;
          auVar13._24_4_ = fVar120 * auVar45._24_4_;
          auVar13._28_4_ = auVar45._28_4_;
          pfVar2 = (float *)(uVar32 + 0x100 + uVar38);
          pfVar1 = (float *)(uVar32 + 0x40 + uVar38);
          auVar54._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar54._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar54._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar54._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar54._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar54._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar54._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar54._28_4_ = auVar56._28_4_ + pfVar1[7];
          auVar28._4_4_ = fVar5;
          auVar28._0_4_ = fVar5;
          auVar28._8_4_ = fVar5;
          auVar28._12_4_ = fVar5;
          auVar28._16_4_ = fVar5;
          auVar28._20_4_ = fVar5;
          auVar28._24_4_ = fVar5;
          auVar28._28_4_ = fVar5;
          auVar45 = vsubps_avx(auVar54,auVar28);
          fVar86 = auVar66._0_4_;
          fVar96 = auVar66._4_4_;
          auVar14._4_4_ = fVar96 * auVar45._4_4_;
          auVar14._0_4_ = fVar86 * auVar45._0_4_;
          fVar121 = auVar66._8_4_;
          auVar14._8_4_ = fVar121 * auVar45._8_4_;
          auVar14._12_4_ = auVar66._12_4_ * auVar45._12_4_;
          auVar14._16_4_ = fVar86 * auVar45._16_4_;
          auVar14._20_4_ = fVar96 * auVar45._20_4_;
          auVar14._24_4_ = fVar121 * auVar45._24_4_;
          auVar14._28_4_ = auVar45._28_4_;
          pfVar2 = (float *)(uVar32 + 0x100 + uVar36);
          pfVar1 = (float *)(uVar32 + 0x40 + uVar36);
          auVar59._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar59._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar59._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar59._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar59._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar59._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar59._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar59._28_4_ = auVar64._28_4_ + pfVar1[7];
          auVar27._4_4_ = fVar6;
          auVar27._0_4_ = fVar6;
          auVar27._8_4_ = fVar6;
          auVar27._12_4_ = fVar6;
          auVar27._16_4_ = fVar6;
          auVar27._20_4_ = fVar6;
          auVar27._24_4_ = fVar6;
          auVar27._28_4_ = fVar6;
          auVar45 = vsubps_avx(auVar59,auVar27);
          fVar88 = auVar77._0_4_;
          fVar97 = auVar77._4_4_;
          auVar15._4_4_ = fVar97 * auVar45._4_4_;
          auVar15._0_4_ = fVar88 * auVar45._0_4_;
          fVar122 = auVar77._8_4_;
          auVar15._8_4_ = fVar122 * auVar45._8_4_;
          auVar15._12_4_ = auVar77._12_4_ * auVar45._12_4_;
          auVar15._16_4_ = fVar88 * auVar45._16_4_;
          auVar15._20_4_ = fVar97 * auVar45._20_4_;
          auVar15._24_4_ = fVar122 * auVar45._24_4_;
          auVar15._28_4_ = auVar45._28_4_;
          pfVar2 = (float *)(uVar32 + 0x100 + (uVar39 ^ 0x20));
          auVar45 = vmaxps_avx(auVar14,auVar15);
          pfVar1 = (float *)(uVar32 + 0x40 + (uVar39 ^ 0x20));
          auVar60._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar60._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar60._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar60._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar60._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar60._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar60._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar60._28_4_ = auVar71._28_4_ + pfVar1[7];
          auVar11 = vsubps_avx(auVar60,auVar29);
          pfVar2 = (float *)(uVar32 + 0x100 + (uVar38 ^ 0x20));
          pfVar1 = (float *)(uVar32 + 0x40 + (uVar38 ^ 0x20));
          auVar69._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar69._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar69._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar69._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar69._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar69._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar69._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar69._28_4_ = auVar71._28_4_ + pfVar1[7];
          auVar16._4_4_ = fVar95 * auVar11._4_4_;
          auVar16._0_4_ = fVar85 * auVar11._0_4_;
          auVar16._8_4_ = fVar120 * auVar11._8_4_;
          auVar16._12_4_ = fVar87 * auVar11._12_4_;
          auVar16._16_4_ = fVar85 * auVar11._16_4_;
          auVar16._20_4_ = fVar95 * auVar11._20_4_;
          auVar16._24_4_ = fVar120 * auVar11._24_4_;
          auVar16._28_4_ = auVar11._28_4_;
          auVar64 = ZEXT3264(auVar16);
          auVar11 = vsubps_avx(auVar69,auVar28);
          pfVar2 = (float *)(uVar32 + 0x100 + (uVar36 ^ 0x20));
          auVar17._4_4_ = fVar96 * auVar11._4_4_;
          auVar17._0_4_ = fVar86 * auVar11._0_4_;
          auVar17._8_4_ = fVar121 * auVar11._8_4_;
          auVar17._12_4_ = auVar66._12_4_ * auVar11._12_4_;
          auVar17._16_4_ = fVar86 * auVar11._16_4_;
          auVar17._20_4_ = fVar96 * auVar11._20_4_;
          auVar17._24_4_ = fVar121 * auVar11._24_4_;
          auVar17._28_4_ = auVar11._28_4_;
          pfVar1 = (float *)(uVar32 + 0x40 + (uVar36 ^ 0x20));
          auVar75._0_4_ = fVar118 * *pfVar2 + *pfVar1;
          auVar75._4_4_ = fVar81 * pfVar2[1] + pfVar1[1];
          auVar75._8_4_ = fVar92 * pfVar2[2] + pfVar1[2];
          auVar75._12_4_ = fVar119 * pfVar2[3] + pfVar1[3];
          auVar75._16_4_ = fVar118 * pfVar2[4] + pfVar1[4];
          auVar75._20_4_ = fVar81 * pfVar2[5] + pfVar1[5];
          auVar75._24_4_ = fVar92 * pfVar2[6] + pfVar1[6];
          auVar75._28_4_ = fVar79 + pfVar1[7];
          auVar11 = vsubps_avx(auVar75,auVar27);
          auVar18._4_4_ = fVar97 * auVar11._4_4_;
          auVar18._0_4_ = fVar88 * auVar11._0_4_;
          auVar18._8_4_ = fVar122 * auVar11._8_4_;
          auVar18._12_4_ = auVar77._12_4_ * auVar11._12_4_;
          auVar18._16_4_ = fVar88 * auVar11._16_4_;
          auVar18._20_4_ = fVar97 * auVar11._20_4_;
          auVar18._24_4_ = fVar122 * auVar11._24_4_;
          auVar18._28_4_ = auVar11._28_4_;
          auVar10 = vminps_avx(auVar17,auVar18);
          auVar71 = ZEXT3264(auVar10);
          auVar11 = vmaxps_avx(auVar109,auVar13);
          auVar45 = vmaxps_avx(auVar11,auVar45);
          auVar11 = vminps_avx(auVar106,auVar16);
          auVar11 = vminps_avx(auVar11,auVar10);
          auVar45 = vcmpps_avx(auVar45,auVar11,2);
          if (uVar34 == 6) {
            auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar32 + 0x1c0),auVar42,2);
            auVar10 = vcmpps_avx(auVar42,*(undefined1 (*) [32])(uVar32 + 0x1e0),1);
            auVar10 = vandps_avx(auVar11,auVar10);
            auVar45 = vandps_avx(auVar10,auVar45);
            goto LAB_002e21fd;
          }
          auVar40 = vpackssdw_avx(auVar45._0_16_,auVar45._16_16_);
        }
        auVar56 = ZEXT3264(auVar11);
        auVar40 = vpsllw_avx(auVar40,0xf);
        if ((((((((auVar40 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar40 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar40 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar40 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar40 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar40 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar40 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar40[0xf]
           ) goto LAB_002e1cb1;
        auVar40 = vpacksswb_avx(auVar40,auVar40);
        bVar12 = SUB161(auVar40 >> 7,0) & 1 | (SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar40 >> 0x17,0) & 1) << 2 | (SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar40 >> 0x27,0) & 1) << 4 | (SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar40 >> 0x37,0) & 1) << 6 | SUB161(auVar40 >> 0x3f,0) << 7;
        lVar8 = 0;
        if (bVar12 != 0) {
          for (; (bVar12 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar33 = *(ulong *)(uVar32 + lVar8 * 8);
        uVar34 = bVar12 - 1 & (uint)bVar12;
        if (uVar34 != 0) {
          *puVar37 = uVar33;
          puVar37 = puVar37 + 1;
          lVar8 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar33 = *(ulong *)(uVar32 + lVar8 * 8);
          uVar34 = uVar34 - 1 & uVar34;
          uVar35 = (ulong)uVar34;
          if (uVar34 != 0) {
            do {
              *puVar37 = uVar33;
              puVar37 = puVar37 + 1;
              lVar8 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              uVar33 = *(ulong *)(uVar32 + lVar8 * 8);
              uVar35 = uVar35 & uVar35 - 1;
            } while (uVar35 != 0);
          }
        }
      }
      auVar56 = ZEXT1664(auVar56._0_16_);
      auVar64 = ZEXT1664(auVar64._0_16_);
      auVar71 = ZEXT1664(auVar71._0_16_);
      in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
      cVar31 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar33 & 0xfffffffffffffff0) * 0x40 + 8))
                         (local_1218,ray,context);
    } while (cVar31 == '\0');
    ray->tfar = -INFINITY;
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }